

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

string * __thiscall
helics::ValueFederateManager::getTarget_abi_cxx11_(ValueFederateManager *this,Input *inp)

{
  const_iterator cVar1;
  string *psVar2;
  shared_handle inpHandle;
  shared_handle local_28;
  
  gmlc::libguarded::
  shared_guarded_opt<std::multimap<helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::shared_mutex>
  ::lock_shared(&local_28,&this->inputTargets);
  cVar1 = std::
          _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(local_28.data)->_M_t,&(inp->super_Interface).handle);
  psVar2 = (string *)emptyStr_abi_cxx11_;
  if ((_Rb_tree_header *)cVar1._M_node != &((local_28.data)->_M_t)._M_impl.super__Rb_tree_header) {
    psVar2 = (string *)&cVar1._M_node[1]._M_parent;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28.m_handle_lock);
  return psVar2;
}

Assistant:

const std::string& ValueFederateManager::getTarget(const Input& inp) const
{
    auto inpHandle = inputTargets.lock_shared();
    auto fnd = inpHandle->find(inp.handle);
    if (fnd != inpHandle->end()) {
        return fnd->second;
    }
    return emptyStr;
}